

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::loadShaderData
          (COpenGL3DriverBase *this,path *vertexShaderName,path *fragmentShaderName,
          c8 **vertexShaderData,c8 **fragmentShaderData)

{
  char *pcVar1;
  Printer *pPVar2;
  void *pvVar3;
  long *in_RCX;
  IReferenceCounted *in_RDI;
  long *in_R8;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  long size;
  string warning_1;
  IReadFile *fsFile;
  string warning;
  IReadFile *vsFile;
  path fsPath;
  path vsPath;
  string<char> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  allocator<char> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  long local_d0;
  allocator<char> local_c1;
  string local_c0 [32];
  long *local_a0;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90 [32];
  long *local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  long *local_28;
  long *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  core::string<char>::string(in_stack_fffffffffffffde0,(string<char> *)in_RDI);
  core::string<char>::operator+=(in_stack_fffffffffffffde0,(string<char> *)in_RDI);
  core::string<char>::string(in_stack_fffffffffffffde0,(string<char> *)in_RDI);
  core::string<char>::operator+=(in_stack_fffffffffffffde0,(string<char> *)in_RDI);
  *local_20 = 0;
  *local_28 = 0;
  local_70 = (long *)(**(code **)**(undefined8 **)&in_RDI[0xc]._vptr_IReferenceCounted)
                               (*(undefined8 **)&in_RDI[0xc]._vptr_IReferenceCounted,local_48);
  if (local_70 == (long *)0x0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    ::std::allocator<char>::~allocator(&local_91);
    core::string<char>::c_str((string<char> *)0x35e0c1);
    pcVar1 = (char *)::std::__cxx11::string::append((char *)local_90);
    ::std::__cxx11::string::append(pcVar1);
    ::std::__cxx11::string::operator+=
              (local_90,"Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath");
    pPVar2 = (Printer *)::std::__cxx11::string::c_str();
    os::Printer::log(pPVar2,__x);
    local_98 = 1;
    ::std::__cxx11::string::~string(local_90);
  }
  else {
    local_a0 = (long *)(**(code **)**(undefined8 **)&in_RDI[0xc]._vptr_IReferenceCounted)
                                 (*(undefined8 **)&in_RDI[0xc]._vptr_IReferenceCounted,local_68);
    if (local_a0 == (long *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      ::std::allocator<char>::~allocator(&local_c1);
      core::string<char>::c_str((string<char> *)0x35e19d);
      pcVar1 = (char *)::std::__cxx11::string::append((char *)local_c0);
      ::std::__cxx11::string::append(pcVar1);
      ::std::__cxx11::string::operator+=
                (local_c0,"Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath");
      pPVar2 = (Printer *)::std::__cxx11::string::c_str();
      os::Printer::log(pPVar2,__x_00);
      local_98 = 1;
      ::std::__cxx11::string::~string(local_c0);
    }
    else {
      local_d0 = (**(code **)(*local_70 + 0x10))();
      if (local_d0 != 0) {
        pvVar3 = operator_new__(local_d0 + 1);
        *local_20 = (long)pvVar3;
        (**(code **)*local_70)(local_70,*local_20,local_d0);
        *(undefined1 *)(*local_20 + local_d0) = 0;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::__cxx11::to_string((long)in_stack_fffffffffffffe08);
      ::std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      ::std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      core::string<char>::c_str((string<char> *)0x35e302);
      ::std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      ::std::__cxx11::string::~string(local_110);
      ::std::__cxx11::string::~string(local_130);
      ::std::__cxx11::string::~string(local_178);
      ::std::__cxx11::string::~string(local_150);
      ::std::allocator<char>::~allocator(&local_151);
      pPVar2 = (Printer *)::std::__cxx11::string::c_str();
      os::Printer::log(pPVar2,__x_01);
      ::std::__cxx11::string::~string(local_f0);
      local_d0 = (**(code **)(*local_a0 + 0x10))();
      if (local_d0 != 0) {
        if (local_a0 == local_70) {
          (**(code **)(*local_a0 + 8))(local_a0,0,0);
        }
        pvVar3 = operator_new__(local_d0 + 1);
        *local_28 = (long)pvVar3;
        (**(code **)*local_a0)(local_a0,*local_28,local_d0);
        *(undefined1 *)(*local_28 + local_d0) = 0;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::__cxx11::to_string((long)in_stack_fffffffffffffe08);
      ::std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      ::std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      core::string<char>::c_str((string<char> *)0x35e488);
      ::std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      ::std::__cxx11::string::~string(local_1b8);
      ::std::__cxx11::string::~string(local_1d8);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
      pPVar2 = (Printer *)::std::__cxx11::string::c_str();
      os::Printer::log(pPVar2,__x_02);
      ::std::__cxx11::string::~string(local_198);
      IReferenceCounted::drop(in_RDI);
      IReferenceCounted::drop(in_RDI);
      local_98 = 0;
    }
  }
  core::string<char>::~string((string<char> *)0x35e536);
  core::string<char>::~string((string<char> *)0x35e543);
  return;
}

Assistant:

void COpenGL3DriverBase::loadShaderData(const io::path &vertexShaderName, const io::path &fragmentShaderName, c8 **vertexShaderData, c8 **fragmentShaderData)
{
	io::path vsPath(OGLES2ShaderPath);
	vsPath += vertexShaderName;

	io::path fsPath(OGLES2ShaderPath);
	fsPath += fragmentShaderName;

	*vertexShaderData = 0;
	*fragmentShaderData = 0;

	io::IReadFile *vsFile = FileSystem->createAndOpenFile(vsPath);
	if (!vsFile) {
		std::string warning("Warning: Missing shader files needed to simulate fixed function materials:\n");
		warning.append(vsPath.c_str()).append("\n");
		warning += "Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath";
		os::Printer::log(warning.c_str(), ELL_WARNING);
		return;
	}

	io::IReadFile *fsFile = FileSystem->createAndOpenFile(fsPath);
	if (!fsFile) {
		std::string warning("Warning: Missing shader files needed to simulate fixed function materials:\n");
		warning.append(fsPath.c_str()).append("\n");
		warning += "Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath";
		os::Printer::log(warning.c_str(), ELL_WARNING);
		return;
	}

	long size = vsFile->getSize();
	if (size) {
		*vertexShaderData = new c8[size + 1];
		vsFile->read(*vertexShaderData, size);
		(*vertexShaderData)[size] = 0;
	}
	{
		auto tmp = std::string("Loaded ") + std::to_string(size) + " bytes for vertex shader " + vertexShaderName.c_str();
		os::Printer::log(tmp.c_str(), ELL_INFORMATION);
	}

	size = fsFile->getSize();
	if (size) {
		// if both handles are the same we must reset the file
		if (fsFile == vsFile)
			fsFile->seek(0);

		*fragmentShaderData = new c8[size + 1];
		fsFile->read(*fragmentShaderData, size);
		(*fragmentShaderData)[size] = 0;
	}
	{
		auto tmp = std::string("Loaded ") + std::to_string(size) + " bytes for fragment shader " + fragmentShaderName.c_str();
		os::Printer::log(tmp.c_str(), ELL_INFORMATION);
	}

	vsFile->drop();
	fsFile->drop();
}